

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

int __thiscall
ki::dml::
Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
::clone(Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  *this_00;
  string local_38 [32];
  Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  *local_18;
  Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  *clone;
  Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  *this_local;
  
  clone = this;
  this_00 = (Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
             *)operator_new(0x58);
  std::__cxx11::string::string(local_38,(string *)&(this->super_FieldBase).m_name);
  Field(this_00,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  (this_00->super_FieldBase).m_transferable = (bool)((this->super_FieldBase).m_transferable & 1);
  local_18 = this_00;
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  operator=(&this_00->m_value,&this->m_value);
  return (int)local_18;
}

Assistant:

Field<ValueT> *clone() const override final
		{
			auto *clone = new Field<ValueT>(m_name);
			clone->m_transferable = m_transferable;
			clone->m_value = m_value;
			return clone;
		}